

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O3

vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
* __thiscall
license::hw_identifier::DefaultStrategy::alternative_ids
          (vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           *__return_storage_ptr__,DefaultStrategy *this)

{
  LCC_API_HW_IDENTIFICATION_STRATEGY *pLVar1;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  alt_ids;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategy_to_try;
  IdentificationStrategy local_60;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  local_58;
  LCC_API_HW_IDENTIFICATION_STRATEGY *local_40;
  LCC_API_HW_IDENTIFICATION_STRATEGY *local_38;
  
  available_strategies();
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40 != local_38) {
    pLVar1 = local_40;
    do {
      IdentificationStrategy::get_strategy(&local_60,*pLVar1);
      (**(code **)(*local_60._vptr_IdentificationStrategy + 0x20))(&local_58);
      std::
      vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<license::hw_identifier::HwIdentifier*,std::vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>>>
                ((vector<license::hw_identifier::HwIdentifier,std::allocator<license::hw_identifier::HwIdentifier>>
                  *)__return_storage_ptr__,
                 local_58.
                 super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_58.
                 super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__return_storage_ptr__->
                 super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ::~vector(&local_58);
      if (local_60._vptr_IdentificationStrategy != (_func_int **)0x0) {
        (**(code **)(*local_60._vptr_IdentificationStrategy + 8))();
      }
      pLVar1 = pLVar1 + 1;
    } while (pLVar1 != local_38);
  }
  if (local_40 != (LCC_API_HW_IDENTIFICATION_STRATEGY *)0x0) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<HwIdentifier> DefaultStrategy::alternative_ids() const {
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try = available_strategies();
	vector<HwIdentifier> identifiers;
	FUNCTION_RETURN ret = FUNC_RET_NOT_AVAIL;
	for (auto it : strategy_to_try) {
		LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try = it;
		unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strat_to_try);
		vector<HwIdentifier> alt_ids = strategy_ptr->alternative_ids();
		identifiers.insert(alt_ids.begin(), alt_ids.end(), identifiers.end());
	}
	return identifiers;
}